

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat * __thiscall Mat::operator+(Mat *this,Mat *a)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  reference pvVar8;
  long lVar9;
  long in_RDX;
  int *in_RSI;
  Mat *in_RDI;
  int i;
  int l;
  Mat *ret;
  long local_a0;
  undefined8 in_stack_ffffffffffffff68;
  Mat *in_stack_ffffffffffffff70;
  long local_78;
  long local_70;
  int local_24;
  
  Mat(in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
      (int)in_stack_ffffffffffffff68);
  iVar1 = *in_RSI;
  iVar2 = in_RSI[1];
  for (local_24 = 0; local_24 < iVar1 * iVar2; local_24 = local_24 + 1) {
    puVar7 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                ((vector<__int128,_std::allocator<__int128>_> *)(in_RSI + 4),
                                 (long)local_24);
    uVar3 = *puVar7;
    uVar4 = puVar7[1];
    puVar7 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                ((vector<__int128,_std::allocator<__int128>_> *)(in_RDX + 0x10),
                                 (long)local_24);
    uVar5 = *puVar7;
    uVar6 = puVar7[1];
    pvVar8 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                       (&in_RDI->val,(long)local_24);
    *(ulong *)((long)pvVar8 + 8) = uVar4 + uVar6 + (ulong)CARRY8(uVar3,uVar5);
    *(ulong *)pvVar8 = uVar3 + uVar5;
    puVar7 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                (&in_RDI->val,(long)local_24);
    if ((long)puVar7[1] < (long)(ulong)(*puVar7 < 0x16345785d8a0003)) {
      pvVar8 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                         (&in_RDI->val,(long)local_24);
      local_78 = (long)*pvVar8;
      local_70 = *(long *)((long)pvVar8 + 8);
    }
    else {
      puVar7 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                  (&in_RDI->val,(long)local_24);
      local_78 = *puVar7 + 0xfe9cba87a275fffd;
      local_70 = (puVar7[1] - 1) + (ulong)(0x16345785d8a0002 < *puVar7);
    }
    pvVar8 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                       (&in_RDI->val,(long)local_24);
    *(long *)((long)pvVar8 + 8) = local_70;
    *(long *)pvVar8 = local_78;
    puVar7 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                (&in_RDI->val,(long)local_24);
    lVar9 = -1 - puVar7[1];
    if ((SBORROW8(-1,puVar7[1]) != SBORROW8(lVar9,(ulong)(0xfe9cba87a275fffd < *puVar7))) ==
        (long)(lVar9 - (ulong)(0xfe9cba87a275fffd < *puVar7)) < 0) {
      puVar7 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                  (&in_RDI->val,(long)local_24);
      local_a0 = *puVar7 + 0x16345785d8a0003;
      lVar9 = puVar7[1] + (ulong)(0xfe9cba87a275fffc < *puVar7);
    }
    else {
      pvVar8 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                         (&in_RDI->val,(long)local_24);
      local_a0 = (long)*pvVar8;
      lVar9 = *(long *)((long)pvVar8 + 8);
    }
    pvVar8 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                       (&in_RDI->val,(long)local_24);
    *(long *)((long)pvVar8 + 8) = lVar9;
    *(long *)pvVar8 = local_a0;
  }
  return in_RDI;
}

Assistant:

Mat Mat::operator+(const Mat &a) {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = val[i] + a.val[i];
        ret.val[i] = ret.val[i] >= MOD ? ret.val[i] - MOD : ret.val[i];
        ret.val[i] = ret.val[i] <= -MOD ? ret.val[i] + MOD : ret.val[i];
    }
    return ret;
}